

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O1

void __thiscall
duckdb::WindowSegmentTreePart::FlushStates(WindowSegmentTreePart *this,bool combining)

{
  aggregate_update_t p_Var1;
  FunctionDataWrapper *pFVar2;
  pointer pWVar3;
  reference pvVar4;
  AggregateInputData aggr_input_data;
  AggregateInputData local_38;
  
  if (this->flush_count != 0) {
    if ((this->aggr->bind_data_wrapper).internal.
        super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      local_38.bind_data.ptr = (FunctionData *)0x0;
    }
    else {
      pFVar2 = shared_ptr<duckdb::FunctionDataWrapper,_true>::operator->
                         (&this->aggr->bind_data_wrapper);
      local_38.bind_data.ptr =
           (pFVar2->function_data).
           super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
           super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
           .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    }
    local_38.allocator = this->allocator;
    local_38.combine_type = PRESERVE_INPUT;
    if (combining) {
      Vector::Verify(&this->statel,this->flush_count);
      (*(this->aggr->function).combine)(&this->statel,&this->statep,&local_38,this->flush_count);
    }
    else {
      pWVar3 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
               operator->(&this->cursor);
      DataChunk::Slice(&this->leaves,&pWVar3->chunk,&this->filter_sel,this->flush_count,0);
      p_Var1 = (this->aggr->function).update;
      pvVar4 = vector<duckdb::Vector,_true>::operator[](&(this->leaves).data,0);
      (*p_Var1)(pvVar4,&local_38,
                ((long)(this->leaves).data.
                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->leaves).data.
                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5,&this->statep,
                this->flush_count);
    }
    this->flush_count = 0;
  }
  return;
}

Assistant:

void WindowSegmentTreePart::FlushStates(bool combining) {
	if (!flush_count) {
		return;
	}

	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	if (combining) {
		statel.Verify(flush_count);
		aggr.function.combine(statel, statep, aggr_input_data, flush_count);
	} else {
		auto &scanned = cursor->chunk;
		leaves.Slice(scanned, filter_sel, flush_count);
		aggr.function.update(&leaves.data[0], aggr_input_data, leaves.ColumnCount(), statep, flush_count);
	}

	flush_count = 0;
}